

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O0

OptionContext * __thiscall
Potassco::ProgramOptions::OptionContext::addAlias
          (OptionContext *this,string *aliasName,option_iterator option)

{
  bool bVar1;
  byte bVar2;
  undefined8 uVar3;
  OptionContext *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_bool>
  pVar4;
  key_type k;
  OptionContext *in_stack_ffffffffffffff38;
  __normal_iterator<const_Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_*,_std::vector<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>_>
  *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *this_00;
  byte local_89;
  string *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  DuplicateOption *in_stack_ffffffffffffffa0;
  
  end(in_stack_ffffffffffffff38);
  bVar1 = __gnu_cxx::operator!=
                    (in_stack_ffffffffffffff40,
                     (__normal_iterator<const_Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_*,_std::vector<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>_>
                      *)in_stack_ffffffffffffff38);
  local_89 = 0;
  if (bVar1) {
    local_89 = std::__cxx11::string::empty();
    local_89 = local_89 ^ 0xff;
  }
  if ((local_89 & 1) != 0) {
    begin(in_stack_ffffffffffffff38);
    __gnu_cxx::operator-
              (in_stack_ffffffffffffff40,
               (__normal_iterator<const_Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_*,_std::vector<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>_>
                *)in_stack_ffffffffffffff38);
    this_00 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
               *)&stack0xffffffffffffff98;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
    ::pair<unsigned_long_&,_true>
              (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
               (unsigned_long *)in_stack_ffffffffffffff40);
    pVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
            ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                      *)this_00,
                     (value_type *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    bVar2 = pVar4.second ^ 0xff;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
             *)0x257086);
    if ((bVar2 & 1) != 0) {
      uVar3 = __cxa_allocate_exception(0x58);
      caption_abi_cxx11_(in_RDI);
      DuplicateOption::DuplicateOption
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      __cxa_throw(uVar3,&DuplicateOption::typeinfo,DuplicateOption::~DuplicateOption);
    }
  }
  return in_RDI;
}

Assistant:

OptionContext& OptionContext::addAlias(const std::string& aliasName, option_iterator option) {
	if (option != end() && !aliasName.empty()) {
		key_type k(option - begin());
		if (!index_.insert(Name2Key::value_type(aliasName, k)).second) { throw DuplicateOption(caption(), aliasName); }
	}
	return *this;
}